

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void is_item_discoverable(tgestate_t *state)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  
  if (state->room_index == '\0') {
    lVar2 = 0x227;
    do {
      if (((*(char *)((long)state->jmpbuf_main[0].__jmpbuf + lVar2 + -0x20) < '\0') &&
          (bVar3 = *(byte *)((long)state->jmpbuf_main[0].__jmpbuf + lVar2 + -0x21) & 0xf, bVar3 != 7
          )) && (bVar3 != 0xb)) goto LAB_0010a28d;
      lVar2 = lVar2 + 7;
    } while ((char)lVar2 != -0x69);
  }
  else {
    iVar1 = is_item_discoverable_interior(state,state->room_index,(item_t *)0x0);
    if (iVar1 == 0) {
LAB_0010a28d:
      hostiles_pursue(state);
      return;
    }
  }
  return;
}

Assistant:

void is_item_discoverable(tgestate_t *state)
{
  room_t              room;       /* was A */
  const itemstruct_t *itemstruct; /* was HL */
  uint8_t             iters;      /* was B */
  item_t              item;       /* was A */

  assert(state != NULL);

  room = state->room_index;
  if (room != room_0_OUTDOORS)
  {
    /* Interior. */

    if (is_item_discoverable_interior(state, room, NULL) == 0)
      /* Item was found. */
      hostiles_pursue(state);
  }
  else
  {
    /* Exterior. */

    itemstruct = &state->item_structs[0];
    iters      = item__LIMIT;
    do
    {
      if (itemstruct->room_and_flags & itemstruct_ROOM_FLAG_NEARBY_7)
        goto nearby;
next:
      itemstruct++;
    }
    while (--iters);
    return;

nearby:
    /* FUTURE: Merge into loop. */
    item = itemstruct->item_and_flags & itemstruct_ITEM_MASK;

    /* The green key and food items are ignored. */
    if (item == item_GREEN_KEY || item == item_FOOD)
      goto next;

    /* BUG FIX: In the original game the itemstruct pointer is decremented to
     * access item_and_flags but is not re-adjusted afterwards. */

    hostiles_pursue(state);
  }
}